

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomdiscard(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  expr *peVar3;
  expr **ppeVar4;
  int iVar5;
  
  if (ctx->reverse == 0) {
    peVar3 = makeex(EXPR_DISCARD);
    iVar5 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    if (iVar5 < iVar1) {
      ppeVar4 = ctx->atoms;
    }
    else {
      iVar5 = 0x10;
      if (iVar1 != 0) {
        iVar5 = iVar1 * 2;
      }
      ctx->atomsmax = iVar5;
      ppeVar4 = (expr **)realloc(ctx->atoms,(long)iVar5 << 3);
      ctx->atoms = ppeVar4;
      iVar5 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar5 + 1;
    ppeVar4[iVar5] = peVar3;
  }
  else if ((ctx->line->atomsnum != spos) && (ctx->line->atoms[spos]->type == EXPR_DISCARD)) {
    pmVar2 = alwaysmatches(spos + 1);
    return pmVar2;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomdiscard APROTO {
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		if (ctx->line->atoms[spos]->type == EXPR_DISCARD) {
			return alwaysmatches(spos+1);
		} else {
			return 0;
		}
	}
	struct expr *expr = makeex(EXPR_DISCARD);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}